

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  short sVar2;
  WhereConst *pWVar3;
  Parse *pPVar4;
  AggInfo *pAVar5;
  ExprList *pEVar6;
  Expr *pEVar7;
  undefined8 in_RAX;
  AggInfo_col *pAVar8;
  AggInfo_func *pAVar9;
  FuncDef *pFVar10;
  uint uVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  ExprList_item *pEVar15;
  int iVar16;
  int i;
  int i_1;
  undefined8 local_38;
  
  pWVar3 = (pWalker->u).pConst;
  pPVar4 = pWVar3->pParse;
  piVar12 = *(int **)&pWVar3->nConst;
  pAVar5 = (AggInfo *)pWVar3->apExpr;
  uVar1 = pExpr->op;
  local_38 = in_RAX;
  if (uVar1 != 0xa4) {
    if (uVar1 == 0xa3) {
      if (((ulong)pWVar3[1].apExpr & 8) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      iVar14 = pAVar5->nFunc;
      if (iVar14 < 1) {
        uVar13 = 0;
      }
      else {
        pAVar9 = pAVar5->aFunc;
        uVar13 = 0;
        do {
          iVar16 = sqlite3ExprCompare((Parse *)0x0,pAVar9->pExpr,pExpr,-1);
          iVar14 = pAVar5->nFunc;
          if (iVar16 == 0) break;
          uVar11 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar11;
          pAVar9 = pAVar9 + 1;
        } while ((int)uVar11 < iVar14);
      }
      if (iVar14 <= (int)uVar13) {
        uVar1 = pPVar4->db->enc;
        pAVar9 = (AggInfo_func *)
                 sqlite3ArrayAllocate
                           (pPVar4->db,pAVar5->aFunc,0x18,&pAVar5->nFunc,
                            (int *)((long)&local_38 + 4));
        pAVar5->aFunc = pAVar9;
        uVar13 = (ulong)local_38._4_4_;
        if (-1 < (long)uVar13) {
          pAVar9[uVar13].pExpr = pExpr;
          iVar14 = pPVar4->nMem + 1;
          pPVar4->nMem = iVar14;
          pAVar9[uVar13].iMem = iVar14;
          if ((pExpr->x).pList == (ExprList *)0x0) {
            iVar14 = 0;
          }
          else {
            iVar14 = ((pExpr->x).pList)->nExpr;
          }
          pFVar10 = sqlite3FindFunction(pPVar4->db,(pExpr->u).zToken,iVar14,uVar1,'\0');
          pAVar9[uVar13].pFunc = pFVar10;
          iVar14 = -1;
          if ((pExpr->flags & 2) != 0) {
            iVar14 = pPVar4->nTab;
            pPVar4->nTab = iVar14 + 1;
          }
          pAVar9[uVar13].iDistinct = iVar14;
        }
      }
      pExpr->iAgg = (i16)uVar13;
      pExpr->pAggInfo = pAVar5;
      return 1;
    }
    if (uVar1 != 0xa2) {
      return 0;
    }
  }
  if ((piVar12 != (int *)0x0) && (iVar14 = *piVar12, 0 < iVar14)) {
    piVar12 = piVar12 + 0x12;
    do {
      if (pExpr->iTable == *piVar12) {
        if (pAVar5->nColumn < 1) goto LAB_001907d8;
        piVar12 = &pAVar5->aCol->iColumn;
        uVar13 = 0;
        goto LAB_001907bb;
      }
      piVar12 = piVar12 + 0x1c;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  return 1;
  while( true ) {
    uVar11 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar11;
    piVar12 = piVar12 + 8;
    if (pAVar5->nColumn == uVar11) break;
LAB_001907bb:
    if ((piVar12[-1] == pExpr->iTable) && (*piVar12 == (int)pExpr->iColumn)) goto LAB_0019088a;
  }
LAB_001907d8:
  pAVar8 = (AggInfo_col *)
           sqlite3ArrayAllocate(pPVar4->db,pAVar5->aCol,0x20,&pAVar5->nColumn,(int *)&local_38);
  pAVar5->aCol = pAVar8;
  uVar13 = (ulong)(int)local_38;
  if (-1 < (long)uVar13) {
    *(anon_union_8_3_c79b3df9_for_y *)(pAVar8 + uVar13) = pExpr->y;
    iVar14 = pExpr->iTable;
    pAVar8[uVar13].iTable = iVar14;
    sVar2 = pExpr->iColumn;
    pAVar8[uVar13].iColumn = (int)sVar2;
    iVar16 = pPVar4->nMem + 1;
    pPVar4->nMem = iVar16;
    pAVar8[uVar13].iMem = iVar16;
    pAVar8[uVar13].pExpr = pExpr;
    pEVar6 = pAVar5->pGroupBy;
    if ((pEVar6 != (ExprList *)0x0) && (0 < pEVar6->nExpr)) {
      pEVar15 = pEVar6->a;
      iVar16 = 0;
      do {
        pEVar7 = pEVar15->pExpr;
        if (((pEVar7->op == 0xa2) && (pEVar7->iTable == iVar14)) && (pEVar7->iColumn == sVar2))
        goto LAB_00190886;
        iVar16 = iVar16 + 1;
        pEVar15 = pEVar15 + 1;
      } while (pEVar6->nExpr != iVar16);
    }
    iVar16 = pAVar5->nSortingColumn;
    pAVar5->nSortingColumn = iVar16 + 1;
LAB_00190886:
    pAVar8[uVar13].iSorterColumn = iVar16;
  }
LAB_0019088a:
  pExpr->pAggInfo = pAVar5;
  pExpr->op = 0xa4;
  pExpr->iAgg = (i16)uVar13;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->y.pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(0, pItem->pExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, 
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}